

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O3

Vector3 * __thiscall Vector3::reflect(Vector3 *this,Vector3 *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3 *in_RDI;
  double dVar5;
  
  dVar1 = this->z;
  dVar2 = n->z;
  dVar3 = this->y;
  dVar4 = n->y;
  dVar5 = dVar1 * dVar2 + this->x * n->x + dVar3 * dVar4;
  dVar5 = dVar5 + dVar5;
  in_RDI->x = this->x - dVar5 * n->x;
  in_RDI->y = dVar3 - dVar5 * dVar4;
  in_RDI->z = dVar1 - dVar2 * dVar5;
  return in_RDI;
}

Assistant:

Vector3 Vector3::reflect(const Vector3& n) const
{
    return *this - n * (2 * this->dot(n));
}